

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O3

void __thiscall
ymfm::ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::resample_1_n<3>
          (ssg_resampler<ymfm::ymfm_output<3>,_2,_true> *this,ymfm_output<3> *output,
          uint32_t numsamples)

{
  uint32_t uVar1;
  int32_t sum2;
  int iVar2;
  int32_t sum0;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (numsamples != 0) {
    uVar1 = 0;
    do {
      iVar5 = 3;
      iVar2 = 0;
      iVar4 = 0;
      iVar3 = 0;
      do {
        ssg_engine::clock(this->m_ssg);
        ssg_engine::output(this->m_ssg,&this->m_last);
        iVar3 = iVar3 + (this->m_last).data[0];
        iVar4 = iVar4 + (this->m_last).data[1];
        iVar2 = iVar2 + (this->m_last).data[2];
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      output->data[2] = ((iVar4 + iVar3 + iVar2) * 2) / 9;
      this->m_sampindex = this->m_sampindex + 1;
      uVar1 = uVar1 + 1;
      output = output + 1;
    } while (uVar1 != numsamples);
  }
  return;
}

Assistant:

void ssg_resampler<OutputType, FirstOutput, MixTo1>::resample_1_n(OutputType *output, uint32_t numsamples)
{
	for (uint32_t samp = 0; samp < numsamples; samp++, output++)
	{
		int32_t sum0 = 0, sum1 = 0, sum2 = 0;
		for (int rep = 0; rep < Divisor; rep++)
			clock_and_add(sum0, sum1, sum2);
		write_to_output(output, sum0, sum1, sum2, Divisor);
	}
}